

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall FpgaIO::ReadKSZ8851Reg(FpgaIO *this,uint8_t addr,uint16_t *rdata)

{
  bool bVar1;
  uint32_t uVar2;
  quadlet_t read_data;
  uint32_t local_1c;
  
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (4 < uVar2) {
    bVar1 = WriteEthernetControl(this,(uint)addr * 0x10000 + (uint)*rdata + 0x1000000);
    if (bVar1) {
      ReadEthernetStatus(this,&local_1c);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"WriteQuadlet failed",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
    }
  }
  return false;
}

Assistant:

bool FpgaIO::ReadKSZ8851Reg(uint8_t addr, uint16_t &rdata)
{
    if (GetFirmwareVersion() < 5) return false;
    quadlet_t write_data = ETH_CTRL_WB_V2 | (static_cast<quadlet_t>(addr) << 16) | rdata;
    if (!WriteEthernetControl(write_data)) {
        std::cout << "WriteQuadlet failed" << std::endl;
        return false;
    }
    quadlet_t read_data;
    if (!ReadEthernetStatus(read_data))
        return false;
    // Check if Ethernet is present
    if (!(read_data&ETH_STAT_PRESENT_V2)) return false;
    // Check if last command had an error
    if (read_data&ETH_STAT_REQ_ERR_V2) return false;
    rdata = static_cast<uint16_t>(read_data);
    return true;
}